

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_statics.cpp
# Opt level: O0

ON_DimStyle * Internal_DimStyleMillimeterArchitectural(void)

{
  ON_UUID id_00;
  ON_DimStyle *in_RDI;
  ON_UUID id;
  ON_DimStyle *dimstyle;
  
  ON_DimStyle::ON_DimStyle(in_RDI);
  id_00.Data4[0] = 0x90;
  id_00.Data4[1] = 0xb2;
  id_00.Data4[2] = 0xfb;
  id_00.Data4[3] = '1';
  id_00.Data4[4] = 0xec;
  id_00.Data4[5] = 'E';
  id_00.Data4[6] = 0x92;
  id_00.Data4[7] = 0x9b;
  id_00.Data1 = 0xe5a4c08f;
  id_00.Data2 = 0x23b3;
  id_00.Data3 = 0x4033;
  Internal_DimStyleInit(L"Millimeter Architectural",-7,id_00,in_RDI);
  Internal_DimStyleMillimeterArchitecturalInit(in_RDI);
  Internal_SystemDimStyleFinalize(in_RDI);
  return in_RDI;
}

Assistant:

static ON_DimStyle Internal_DimStyleMillimeterArchitectural()
{
  const ON_UUID id =
  { 0xe5a4c08f, 0x23b3, 0x4033,{ 0x90, 0xb2, 0xfb, 0x31, 0xec, 0x45, 0x92, 0x9b } };

  ON_DimStyle dimstyle;
  Internal_DimStyleInit(L"Millimeter Architectural", -7, id, dimstyle);
  Internal_DimStyleMillimeterArchitecturalInit(dimstyle);
  Internal_SystemDimStyleFinalize(dimstyle);
  return dimstyle;
}